

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>
mp::internal::
UncheckedCast<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>
          (Expr e)

{
  bool bVar1;
  Kind k;
  char *message;
  BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71> in_RDI;
  BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71> *basic;
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71> expr;
  AssertionFailure *in_stack_ffffffffffffffd0;
  
  k = ExprBase::kind((ExprBase *)0x181f53);
  bVar1 = Is<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>,(mp::expr::Kind)71>>
                    (k);
  if (!bVar1) {
    message = (char *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure(in_stack_ffffffffffffffd0,message);
    __cxa_throw(message,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
  }
  BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>::BasicIfExpr
            ((BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>
              *)0x181fba);
  Unused<mp::BasicExpr<(mp::expr::Kind)71,(mp::expr::Kind)71>*>
            ((BasicExpr<(mp::expr::Kind)71,_(mp::expr::Kind)71> **)&stack0xffffffffffffffd0);
  return (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>,_(mp::expr::Kind)71>)
         (Impl *)in_RDI.super_ExprBase.impl_;
}

Assistant:

inline ExprType internal::UncheckedCast(Expr e) {
  MP_ASSERT(Is<ExprType>(e.kind()), "invalid cast");
  ExprType expr;
  // Make sure that ExprType is a subclass or an instance of BasicExpr.
  BasicExpr<static_cast<expr::Kind>(ExprType::FIRST_KIND),
            static_cast<expr::Kind>(ExprType::LAST_KIND)> &basic = expr;
  internal::Unused(&basic);
  expr.impl_ = e.impl_;
  return expr;
}